

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

char * ctemplate::ExpandIs(Template *tpl,TemplateDictionary *dict,PerExpandData *per_expand_data,
                          bool expected)

{
  bool bVar1;
  long lVar2;
  char *__dest;
  char *__src;
  char *buf;
  string local_48 [8];
  string outstring;
  bool expected_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionary *dict_local;
  Template *tpl_local;
  
  std::__cxx11::string::string(local_48);
  if (per_expand_data == (PerExpandData *)0x0) {
    bVar1 = Template::Expand(tpl,(string *)local_48,(TemplateDictionaryInterface *)dict);
    if (expected != bVar1) {
      printf("ASSERT FAILED, line %d: %s\n",0xac,"expected == tpl->Expand(&outstring, dict)");
      bVar1 = Template::Expand(tpl,(string *)local_48,(TemplateDictionaryInterface *)dict);
      if (expected != bVar1) {
        __assert_fail("expected == tpl->Expand(&outstring, dict)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                      ,0xac,
                      "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                     );
      }
      exit(1);
    }
  }
  else {
    bVar1 = Template::ExpandWithData
                      (tpl,(string *)local_48,(TemplateDictionaryInterface *)dict,per_expand_data);
    if (expected != bVar1) {
      printf("ASSERT FAILED, line %d: %s\n",0xaa,
             "expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)");
      bVar1 = Template::ExpandWithData
                        (tpl,(string *)local_48,(TemplateDictionaryInterface *)dict,per_expand_data)
      ;
      if (expected != bVar1) {
        __assert_fail("expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                      ,0xaa,
                      "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                     );
      }
      exit(1);
    }
  }
  lVar2 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar2 + 1);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  std::__cxx11::string::~string(local_48);
  return __dest;
}

Assistant:

const char* ExpandIs(const Template* tpl, const TemplateDictionary *dict,
                     PerExpandData* per_expand_data, bool expected) {
  string outstring;
  if (per_expand_data)
    ASSERT(expected == tpl->ExpandWithData(&outstring, dict, per_expand_data));
  else
    ASSERT(expected == tpl->Expand(&outstring, dict));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}